

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elf.cc
# Opt level: O1

bool __thiscall
bloaty::anon_unknown_0::ElfObjectFile::GetDisassemblyInfo
          (ElfObjectFile *this,string_view symbol,DataSource symbol_source,DisassemblyInfo *info)

{
  _Rb_tree_header *p_Var1;
  InputFile *pIVar2;
  _Base_ptr addr;
  ulong uVar3;
  bool bVar4;
  iterator iVar5;
  int line;
  char *pcVar6;
  DualMap *translator;
  _Base_ptr p_Var7;
  string_view symbol_00;
  string_view format;
  initializer_list<bloaty::RangeSink_*> __l;
  NameMunger empty_munger;
  uint64_t fileoff;
  vector<bloaty::RangeSink_*,_std::allocator<bloaty::RangeSink_*>_> sink_ptrs;
  SymbolTable symbol_table;
  DualMap base_map;
  RangeSink symbol_sink;
  RangeSink base_sink;
  key_type local_438;
  NameMunger local_428;
  ulong local_410;
  vector<bloaty::RangeSink_*,_std::allocator<bloaty::RangeSink_*>_> local_408;
  string local_3f0;
  _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<unsigned_long,_unsigned_long>_>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<unsigned_long,_unsigned_long>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<unsigned_long,_unsigned_long>_>_>_>
  local_3d0;
  DualMap local_3a0;
  undefined1 local_340 [224];
  RangeSink local_260;
  RangeSink local_148;
  
  local_438._M_str = symbol._M_str;
  local_438._M_len = symbol._M_len;
  local_3a0.vm_map.mappings_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_3a0.vm_map.mappings_._M_t._M_impl.super__Rb_tree_header._M_header;
  local_3a0.vm_map.mappings_._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_3a0.vm_map.mappings_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0
  ;
  local_3a0.vm_map.mappings_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_3a0.file_map.mappings_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_3a0.file_map.mappings_._M_t._M_impl.super__Rb_tree_header._M_header;
  local_3a0.file_map.mappings_._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_3a0.file_map.mappings_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  local_3a0.file_map.mappings_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_428.regexes_.
  super__Vector_base<std::pair<std::unique_ptr<bloaty::ReImpl,_std::default_delete<bloaty::ReImpl>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::unique_ptr<bloaty::ReImpl,_std::default_delete<bloaty::ReImpl>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_428.regexes_.
  super__Vector_base<std::pair<std::unique_ptr<bloaty::ReImpl,_std::default_delete<bloaty::ReImpl>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::unique_ptr<bloaty::ReImpl,_std::default_delete<bloaty::ReImpl>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_428.regexes_.
  super__Vector_base<std::pair<std::unique_ptr<bloaty::ReImpl,_std::default_delete<bloaty::ReImpl>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::unique_ptr<bloaty::ReImpl,_std::default_delete<bloaty::ReImpl>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pIVar2 = (this->super_ObjectFile).file_data_._M_t.
           super___uniq_ptr_impl<bloaty::InputFile,_std::default_delete<bloaty::InputFile>_>._M_t.
           super__Tuple_impl<0UL,_bloaty::InputFile_*,_std::default_delete<bloaty::InputFile>_>.
           super__Head_base<0UL,_bloaty::InputFile_*,_false>._M_head_impl;
  local_3a0.vm_map.mappings_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_3a0.vm_map.mappings_._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_3a0.file_map.mappings_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_3a0.file_map.mappings_._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  Options::Options((Options *)&local_260);
  RangeSink::RangeSink
            (&local_148,pIVar2,(Options *)&local_260,kSegments,(DualMap *)0x0,(Arena *)0x0);
  Options::~Options((Options *)&local_260);
  RangeSink::AddOutput(&local_148,&local_3a0,&local_428);
  __l._M_len = 1;
  __l._M_array = (iterator)&local_260;
  local_260.file_ = (InputFile *)&local_148;
  std::vector<bloaty::RangeSink_*,_std::allocator<bloaty::RangeSink_*>_>::vector
            (&local_408,__l,(allocator_type *)local_340);
  (*(this->super_ObjectFile)._vptr_ObjectFile[3])(this,&local_408);
  p_Var1 = &local_3d0._M_impl.super__Rb_tree_header;
  local_3d0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_3d0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_3d0._M_impl.super__Rb_tree_header._M_node_count = 0;
  pIVar2 = (this->super_ObjectFile).file_data_._M_t.
           super___uniq_ptr_impl<bloaty::InputFile,_std::default_delete<bloaty::InputFile>_>._M_t.
           super__Tuple_impl<0UL,_bloaty::InputFile_*,_std::default_delete<bloaty::InputFile>_>.
           super__Head_base<0UL,_bloaty::InputFile_*,_false>._M_head_impl;
  local_3d0._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  local_3d0._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  Options::Options((Options *)local_340);
  translator = &local_3a0;
  RangeSink::RangeSink(&local_260,pIVar2,(Options *)local_340,symbol_source,translator,(Arena *)0x0)
  ;
  Options::~Options((Options *)local_340);
  RangeSink::AddOutput(&local_260,&info->symbol_map,&local_428);
  ReadELFSymbols((((this->super_ObjectFile).debug_file_)->file_data_)._M_t.
                 super___uniq_ptr_impl<bloaty::InputFile,_std::default_delete<bloaty::InputFile>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_bloaty::InputFile_*,_std::default_delete<bloaty::InputFile>_>
                 .super__Head_base<0UL,_bloaty::InputFile_*,_false>._M_head_impl,&local_260,
                 (SymbolTable *)&local_3d0,false);
  iVar5 = std::
          _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<unsigned_long,_unsigned_long>_>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<unsigned_long,_unsigned_long>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<unsigned_long,_unsigned_long>_>_>_>
          ::find(&local_3d0,&local_438);
  if ((_Rb_tree_header *)iVar5._M_node == p_Var1) {
    symbol_00._M_str._0_4_ = symbol_source;
    symbol_00._M_len = (size_t)local_438._M_str;
    symbol_00._M_str._4_4_ = 0;
    ItaniumDemangle_abi_cxx11_
              ((string *)local_340,(bloaty *)local_438._M_len,symbol_00,(DataSource)translator);
    local_3f0._M_dataplus._M_p = (pointer)local_340._8_8_;
    local_3f0._M_string_length = local_340._0_8_;
    iVar5 = std::
            _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<unsigned_long,_unsigned_long>_>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<unsigned_long,_unsigned_long>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<unsigned_long,_unsigned_long>_>_>_>
            ::find(&local_3d0,(key_type *)&local_3f0);
    if ((undefined1 *)local_340._0_8_ != local_340 + 0x10) {
      operator_delete((void *)local_340._0_8_,local_340._16_8_ + 1);
    }
    if ((_Rb_tree_header *)iVar5._M_node == p_Var1) {
      bVar4 = false;
      goto LAB_001975d0;
    }
  }
  addr = iVar5._M_node[1]._M_left;
  p_Var7 = iVar5._M_node[1]._M_right;
  bVar4 = RangeMap::Translate(&local_3a0.vm_map,(uint64_t)addr,&local_410);
  if (!bVar4) {
    absl::substitute_internal::Arg::Arg((Arg *)local_340,&local_438);
    format._M_str = local_340;
    format._M_len = (size_t)"Couldn\'t translate VM address for function $0";
    absl::Substitute_abi_cxx11_(&local_3f0,(absl *)0x2d,format,(Arg *)translator);
    Throw(local_3f0._M_dataplus._M_p,0x57f);
  }
  if (CARRY8(local_410,(ulong)p_Var7)) {
    line = 0x4b;
    pcVar6 = "integer overflow in addition";
  }
  else {
    pIVar2 = (this->super_ObjectFile).file_data_._M_t.
             super___uniq_ptr_impl<bloaty::InputFile,_std::default_delete<bloaty::InputFile>_>._M_t.
             super__Tuple_impl<0UL,_bloaty::InputFile_*,_std::default_delete<bloaty::InputFile>_>.
             super__Head_base<0UL,_bloaty::InputFile_*,_false>._M_head_impl;
    uVar3 = (pIVar2->data_)._M_len;
    if ((long)&p_Var7->_M_color + local_410 <= uVar3) {
      if (uVar3 < local_410) {
        std::__throw_out_of_range_fmt
                  ("%s: __pos (which is %zu) > __size (which is %zu)","basic_string_view::substr");
      }
      if ((_Base_ptr)(uVar3 - local_410) < p_Var7) {
        p_Var7 = (_Base_ptr)(uVar3 - local_410);
      }
      pcVar6 = (pIVar2->data_)._M_str;
      (info->text)._M_len = (size_t)p_Var7;
      (info->text)._M_str = pcVar6 + local_410;
      info->start_address = (uint64_t)addr;
      bVar4 = ReadElfArchMode((this->super_ObjectFile).file_data_._M_t.
                              super___uniq_ptr_impl<bloaty::InputFile,_std::default_delete<bloaty::InputFile>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_bloaty::InputFile_*,_std::default_delete<bloaty::InputFile>_>
                              .super__Head_base<0UL,_bloaty::InputFile_*,_false>._M_head_impl,
                              &info->arch,&info->mode);
LAB_001975d0:
      RangeSink::~RangeSink(&local_260);
      std::
      _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<unsigned_long,_unsigned_long>_>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<unsigned_long,_unsigned_long>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<unsigned_long,_unsigned_long>_>_>_>
      ::~_Rb_tree(&local_3d0);
      if (local_408.super__Vector_base<bloaty::RangeSink_*,_std::allocator<bloaty::RangeSink_*>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_408.
                        super__Vector_base<bloaty::RangeSink_*,_std::allocator<bloaty::RangeSink_*>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_408.
                              super__Vector_base<bloaty::RangeSink_*,_std::allocator<bloaty::RangeSink_*>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_408.
                              super__Vector_base<bloaty::RangeSink_*,_std::allocator<bloaty::RangeSink_*>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      RangeSink::~RangeSink(&local_148);
      std::
      vector<std::pair<std::unique_ptr<bloaty::ReImpl,_std::default_delete<bloaty::ReImpl>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::unique_ptr<bloaty::ReImpl,_std::default_delete<bloaty::ReImpl>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~vector(&local_428.regexes_);
      std::
      _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_bloaty::RangeMap::Entry>,_std::_Select1st<std::pair<const_unsigned_long,_bloaty::RangeMap::Entry>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_bloaty::RangeMap::Entry>_>_>
      ::~_Rb_tree((_Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_bloaty::RangeMap::Entry>,_std::_Select1st<std::pair<const_unsigned_long,_bloaty::RangeMap::Entry>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_bloaty::RangeMap::Entry>_>_>
                   *)&local_3a0.file_map);
      std::
      _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_bloaty::RangeMap::Entry>,_std::_Select1st<std::pair<const_unsigned_long,_bloaty::RangeMap::Entry>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_bloaty::RangeMap::Entry>_>_>
      ::~_Rb_tree((_Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_bloaty::RangeMap::Entry>,_std::_Select1st<std::pair<const_unsigned_long,_bloaty::RangeMap::Entry>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_bloaty::RangeMap::Entry>_>_>
                   *)&local_3a0);
      return bVar4;
    }
    line = 0x5d;
    pcVar6 = "region out-of-bounds";
  }
  Throw(pcVar6,line);
}

Assistant:

bool GetDisassemblyInfo(const std::string_view symbol,
                          DataSource symbol_source,
                          DisassemblyInfo* info) const override {
    return DoGetDisassemblyInfo(&symbol, symbol_source, info);
  }